

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryFill
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryFill *curr)

{
  char **ptr;
  ExternalInterface *pEVar1;
  Name memory;
  int32_t iVar2;
  Literal *pLVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  Address AVar7;
  bool bVar8;
  undefined1 local_148 [8];
  Flow dest;
  Flow value;
  Flow size;
  undefined1 local_50 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_148,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->value);
    if (value.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&value.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        pLVar3 = Flow::getSingleValue((Flow *)local_148);
        pcVar4 = (char *)Literal::getUnsigned(pLVar3);
        pLVar3 = Flow::getSingleValue((Flow *)&value.breakTo.super_IString.str._M_str);
        pcVar5 = (char *)Literal::getUnsigned(pLVar3);
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_50,this,(Name)(curr->memory).super_IString.str);
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        info.name.super_IString.str._M_str =
             (char *)getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_50,memory);
        pcVar6 = (char *)((long)info.name.super_IString.str._M_str << 0x10);
        if (((pcVar6 < pcVar5 + (long)pcVar4) || (pcVar6 < pcVar4)) || (pcVar6 < pcVar5)) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds memory access in memory.fill");
        }
        pLVar3 = Flow::getSingleValue((Flow *)&dest.breakTo.super_IString.str._M_str);
        iVar2 = Literal::geti32(pLVar3);
        ptr = &size.breakTo.super_IString.str._M_str;
        while (bVar8 = pcVar5 != (char *)0x0, pcVar5 = pcVar5 + -1, bVar8) {
          pEVar1 = *(ExternalInterface **)((long)local_50 + 0x288);
          size.breakTo.super_IString.str._M_str = pcVar4;
          AVar7 = getFinalAddressWithoutOffset
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_50,(Literal *)ptr,1,
                             (Address)info.name.super_IString.str._M_str);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,AVar7.addr,(ulong)(uint)(int)(char)iVar2,info.instance,
                     info.name.super_IString.str._M_len);
          Literal::~Literal((Literal *)ptr);
          pcVar4 = pcVar4 + 1;
        }
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&value.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&value.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&dest.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&dest.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_148);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryFill(MemoryFill* curr) {
    NOTE_ENTER("MemoryFill");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(value);
    NOTE_EVAL1(size);
    Address destVal(dest.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    // FIXME: cheaper wrapping detection?
    if (destVal > memorySize * Memory::kPageSize ||
        sizeVal > memorySize * Memory::kPageSize ||
        destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.fill");
    }
    uint8_t val(value.getSingleValue().geti32());
    for (size_t i = 0; i < sizeVal; ++i) {
      info.instance->externalInterface->store8(
        info.instance->getFinalAddressWithoutOffset(
          Literal(destVal + i), 1, memorySize),
        val,
        info.name);
    }
    return {};
  }